

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_feed_info_db(feed_db_t *db,feed_info_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_2e8 [8];
  char qr [158];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  feed_info_t record;
  feed_info_t **records_local;
  feed_db_t *db_local;
  
  record.feed_contact_url._120_8_ = records;
  db_local._4_4_ = count_rows_db(db,"feed_info");
  stmt._0_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_2e8,
           "SELECT feed_publisher_name, feed_publisher_url, feed_lang,feed_start_date, feed_end_date, feed_version,feed_contact_email, feed_contact_url FROM `feed_info`;"
           ,0x9e);
    sqlite3_prepare_v2(db->conn,local_2e8,-1,(sqlite3_stmt **)(qr + 0x98),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0x212);
    *(void **)record.feed_contact_url._120_8_ = pvVar2;
    if (*(long *)record.feed_contact_url._120_8_ == 0) {
      sqlite3_finalize(stack0xfffffffffffffdb8);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(stack0xfffffffffffffdb8);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_feed_info((feed_info_t *)((long)&record_count + 2));
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,0);
        strcpy((char *)((long)&record_count + 2),(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,1);
        strcpy(record.feed_publisher_name + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,2);
        strcpy(record.feed_publisher_url + 0x78,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,3);
        strcpy(record.feed_lang + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,4);
        strcpy(record.feed_start_date + 1,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,5);
        strcpy(record.feed_end_date + 1,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,6);
        strcpy(record.feed_version + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(stack0xfffffffffffffdb8,7);
        strcpy(record.feed_contact_email + 0x38,(char *)puVar3);
        memcpy((void *)(*(long *)record.feed_contact_url._120_8_ + (long)(int)stmt * 0x212),
               (void *)((long)&record_count + 2),0x212);
        stmt._0_4_ = (int)stmt + 1;
      } while ((int)stmt < db_local._4_4_);
      sqlite3_finalize(stack0xfffffffffffffdb8);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_feed_info_db(feed_db_t *db, feed_info_t **records) {

    feed_info_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "feed_info");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "feed_publisher_name, feed_publisher_url, feed_lang,"
                    "feed_start_date, feed_end_date, feed_version,"
                    "feed_contact_email, feed_contact_url "
                "FROM `feed_info`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_feed_info(&record);

        strcpy(record.feed_publisher_name, sqlite3_column_text(stmt, 0));
        strcpy(record.feed_publisher_url, sqlite3_column_text(stmt, 1));
        strcpy(record.feed_lang, sqlite3_column_text(stmt, 2));
        strcpy(record.feed_start_date, sqlite3_column_text(stmt, 3));
        strcpy(record.feed_end_date, sqlite3_column_text(stmt, 4));
        strcpy(record.feed_version, sqlite3_column_text(stmt, 5));
        strcpy(record.feed_contact_email, sqlite3_column_text(stmt, 6));
        strcpy(record.feed_contact_url, sqlite3_column_text(stmt, 7));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}